

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O1

ErrorNumber test_default_calls(void)

{
  undefined1 auVar1 [16];
  uint in_EAX;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  ErrorNumber errNumber;
  undefined8 uStack_28;
  int iVar12;
  
  auVar1 = _DAT_001892a0;
  uStack_28 = (ulong)in_EAX;
  uVar6 = 0x100000000;
  pdVar3 = inputNegData;
  lVar4 = 0;
  dVar7 = (double)DAT_001892a0;
  dVar8 = DAT_001892a0._8_8_;
  iVar9 = 0;
  iVar10 = 1;
  do {
    iVar12 = (int)(uVar6 >> 0x20);
    auVar11._0_8_ = uVar6 & 0xffffffff;
    auVar11._8_4_ = iVar12;
    auVar11._12_4_ = 0;
    *pdVar3 = -(SUB168(auVar11 | auVar1,0) - dVar7);
    pdVar3[1] = -(SUB168(auVar11 | auVar1,8) - dVar8);
    *(ulong *)((long)inputNegData_int + lVar4) = CONCAT44(-iVar10,-iVar9);
    uVar6 = CONCAT44(iVar12 + 2,(int)uVar6 + 2);
    iVar9 = iVar9 + 2;
    iVar10 = iVar10 + 2;
    pdVar3 = pdVar3 + 2;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 400);
  lVar4 = 0;
  memset(inputZeroData,0,800);
  memset(inputZeroData_int,0,400);
  do {
    do {
      do {
        iVar9 = rand();
        dVar7 = (double)iVar9 * 4.656612873077393e-10;
      } while (dVar7 <= 0.0);
    } while (1.0 <= dVar7);
    inputRandomData[lVar4] = dVar7;
    inputRandomData_int[lVar4] = (int)dVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2000);
  pdVar3 = inputRandFltEpsilon;
  lVar4 = 0;
  do {
    uVar2 = rand();
    bVar5 = (uVar2 & 1) == 0;
    *pdVar3 = *(double *)(&DAT_001892d0 + (ulong)bVar5 * 8);
    *(uint *)((long)inputRandFltEpsilon_int + lVar4) = (uint)!bVar5 * 2 + 0x7fffffff;
    lVar4 = lVar4 + 4;
    pdVar3 = pdVar3 + 1;
  } while (lVar4 != 400);
  pdVar3 = inputRandFltEpsilon;
  lVar4 = 0;
  do {
    uVar2 = rand();
    bVar5 = (uVar2 & 1) == 0;
    *pdVar3 = *(double *)(&DAT_001892e0 + (ulong)bVar5 * 8);
    *(uint *)((long)inputRandFltEpsilon_int + lVar4) = -(uint)bVar5 | 1;
    lVar4 = lVar4 + 4;
    pdVar3 = pdVar3 + 1;
  } while (lVar4 != 400);
  if (doExtensiveProfiling != 0) {
    puts("\n[PROFILING START]");
  }
  TA_ForEachFunc(testDefault,(void *)((long)&uStack_28 + 4));
  if (doExtensiveProfiling != 0) {
    puts("[PROFILING END]");
  }
  return uStack_28._4_4_;
}

Assistant:

static ErrorNumber test_default_calls(void)
{
   ErrorNumber errNumber;
   unsigned int i;
   unsigned int sign;
   double tempDouble;

   errNumber = TA_TEST_PASS;

   for( i=0; i < sizeof(inputNegData)/sizeof(double); i++ )
   {
      inputNegData[i] = -((double)((int)i));
	  inputNegData_int[i] = -(int)i;
   }

   for( i=0; i < sizeof(inputZeroData)/sizeof(double); i++ )
   {
      inputZeroData[i] = 0.0;
	  inputZeroData_int[i] = (int)inputZeroData[i];
   }

   for( i=0; i < sizeof(inputRandomData)/sizeof(double); i++ )
   {
      /* Make 100% sure input range is ]0..1[ */
	  tempDouble = (double)rand() / ((double)(RAND_MAX)+(double)(1));
      while( (tempDouble <= 0.0) || (tempDouble >= 1.0) )
	  {
		  tempDouble = (double)rand() / ((double)(RAND_MAX)+(double)(1));
	  }
      inputRandomData[i] = tempDouble;
      inputRandomData_int[i] = (int)inputRandomData[i];
   }

   for( i=0; i < sizeof(inputRandFltEpsilon)/sizeof(double); i++ )
   {
       sign= (unsigned int)rand()%2;
       inputRandFltEpsilon[i] = (sign?1.0:-1.0)*(FLT_EPSILON);
       inputRandFltEpsilon_int[i] = sign?TA_INTEGER_MIN:TA_INTEGER_MAX;
   }

   for( i=0; i < sizeof(inputRandFltEpsilon)/sizeof(double); i++ )
   {
       sign= (unsigned int)rand()%2;
       inputRandFltEpsilon[i] = (sign?1.0:-1.0)*(DBL_EPSILON);
       inputRandFltEpsilon_int[i] = sign?1:-1;
   }

   if( doExtensiveProfiling )
   {
		   printf( "\n[PROFILING START]\n" );
   }

   TA_ForEachFunc( testDefault, &errNumber );

   if( doExtensiveProfiling )
   {
		   printf( "[PROFILING END]\n" );
   }


   return errNumber;
}